

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O3

void nn_sws_validate_utf8_chunk(nn_sws *self)

{
  int iVar1;
  uint uVar2;
  char *reason;
  ulong uVar3;
  uint8_t *buffer;
  ulong len;
  
  len = self->inmsg_current_chunk_len;
  uVar3 = self->utf8_code_pt_fragment_len;
  buffer = self->inmsg_current_chunk_buf;
  if (uVar3 != 0) {
    if (uVar3 < 4) {
      do {
        len = len - 1;
        if (len == 0xffffffffffffffff) {
          len = 0;
LAB_0015b859:
          if (uVar3 < 4) goto joined_r0x0015b866;
          goto LAB_0015b959;
        }
        self->utf8_code_pt_fragment[uVar3] = *buffer;
        uVar3 = self->utf8_code_pt_fragment_len + 1;
        self->utf8_code_pt_fragment_len = uVar3;
        iVar1 = nn_utf8_code_point(self->utf8_code_pt_fragment,uVar3);
        if (0 < iVar1) {
          buffer = buffer + 1;
          goto LAB_0015b859;
        }
        if (iVar1 == -1) goto LAB_0015b8f3;
        buffer = buffer + 1;
      } while (iVar1 != -2);
      reason = "Invalid UTF-8 code point split on previous frame.";
LAB_0015b934:
      nn_sws_fail_conn(self,0x3ef,reason);
      return;
    }
LAB_0015b94f:
    nn_sws_validate_utf8_chunk_cold_2();
LAB_0015b954:
    nn_sws_validate_utf8_chunk_cold_3();
LAB_0015b959:
    nn_sws_validate_utf8_chunk_cold_1();
  }
joined_r0x0015b866:
  do {
    if (len == 0) {
      self->utf8_code_pt_fragment_len = 0;
      self->utf8_code_pt_fragment[0] = '\0';
      self->utf8_code_pt_fragment[1] = '\0';
      self->utf8_code_pt_fragment[2] = '\0';
      self->utf8_code_pt_fragment[3] = '\0';
      if (self->is_final_frame != 0) {
        self->instate = 4;
        nn_pipebase_received(&self->pipebase);
        return;
      }
LAB_0015b907:
      nn_sws_recv_hdr(self);
      return;
    }
    uVar2 = nn_utf8_code_point(buffer,len);
    if ((int)uVar2 < 1) {
      if (uVar2 == 0xfffffffe) {
        self->utf8_code_pt_fragment_len = 0;
        self->utf8_code_pt_fragment[0] = '\0';
        self->utf8_code_pt_fragment[1] = '\0';
        self->utf8_code_pt_fragment[2] = '\0';
        self->utf8_code_pt_fragment[3] = '\0';
        reason = "Invalid UTF-8 code point in payload.";
        goto LAB_0015b934;
      }
      if (uVar2 != 0xffffffff) {
        do {
        } while( true );
      }
      if (len < 4) {
        self->utf8_code_pt_fragment_len = len;
        memcpy(self->utf8_code_pt_fragment,buffer,len);
LAB_0015b8f3:
        if (self->is_final_frame != 0) {
          reason = "Truncated UTF-8 payload with invalid code point.";
          goto LAB_0015b934;
        }
        goto LAB_0015b907;
      }
      goto LAB_0015b954;
    }
    uVar3 = (ulong)uVar2;
    if (len < uVar3) {
      nn_sws_validate_utf8_chunk_cold_4();
      goto LAB_0015b94f;
    }
    buffer = buffer + uVar3;
    len = len - uVar3;
  } while( true );
}

Assistant:

static void nn_sws_validate_utf8_chunk (struct nn_sws *self)
{
    uint8_t *pos;
    int code_point_len;
    size_t len;

    len = self->inmsg_current_chunk_len;
    pos = self->inmsg_current_chunk_buf;

    /*  For chunked transfers, it's possible that a previous chunk was cut
        intra-code point. That partially-validated code point is reassembled
        with the beginning of the current chunk and checked. */
    if (self->utf8_code_pt_fragment_len) {

        nn_assert (self->utf8_code_pt_fragment_len <
            NN_SWS_UTF8_MAX_CODEPOINT_LEN);

        /*  Keep adding octets from fresh buffer to previous code point
            fragment to check for validity. */
        while (len > 0) {
            self->utf8_code_pt_fragment [self->utf8_code_pt_fragment_len] = *pos;
            self->utf8_code_pt_fragment_len++;
            pos++;
            len--;

            code_point_len = nn_utf8_code_point (self->utf8_code_pt_fragment,
                self->utf8_code_pt_fragment_len);

            if (code_point_len > 0) {
                /*  Valid code point found; continue validating. */
                break;
            }
            else if (code_point_len == NN_SWS_UTF8_INVALID) {
                nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_INVALID_FRAME,
                    "Invalid UTF-8 code point split on previous frame.");
                return;
            }
            else if (code_point_len == NN_SWS_UTF8_FRAGMENT) {
                if (self->is_final_frame) {
                    nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_INVALID_FRAME,
                        "Truncated UTF-8 payload with invalid code point.");
                    return;
                }
                else {
                    /*  This chunk is well-formed; now recv the next chunk. */
                    nn_sws_recv_hdr (self);
                    return;
                }
            }
        }
    }

    if (self->utf8_code_pt_fragment_len >= NN_SWS_UTF8_MAX_CODEPOINT_LEN)
        nn_assert (0);

    while (len > 0) {
        code_point_len = nn_utf8_code_point (pos, len);

        if (code_point_len > 0) {
            /*  Valid code point found; continue validating. */
            nn_assert (len >= (size_t) code_point_len);
            len -= code_point_len;
            pos += code_point_len;
            continue;
        }
        else if (code_point_len == NN_SWS_UTF8_INVALID) {
            self->utf8_code_pt_fragment_len = 0;
            memset (self->utf8_code_pt_fragment, 0,
                NN_SWS_UTF8_MAX_CODEPOINT_LEN);
            nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_INVALID_FRAME,
                "Invalid UTF-8 code point in payload.");
            return;
        }
        else if (code_point_len == NN_SWS_UTF8_FRAGMENT) {
            nn_assert (len < NN_SWS_UTF8_MAX_CODEPOINT_LEN);
            self->utf8_code_pt_fragment_len = len;
            memcpy (self->utf8_code_pt_fragment, pos, len);
            if (self->is_final_frame) {
                nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_INVALID_FRAME,
                    "Truncated UTF-8 payload with invalid code point.");
            }
            else {
                /*  Previous frame ended in the middle of a code point;
                    receive more. */
                nn_sws_recv_hdr (self);
            }
            return;
        }
    }

    /*  Entire buffer is well-formed. */
    nn_assert (len == 0);

    self->utf8_code_pt_fragment_len = 0;
    memset (self->utf8_code_pt_fragment, 0, NN_SWS_UTF8_MAX_CODEPOINT_LEN);

    if (self->is_final_frame) {
        self->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
        nn_pipebase_received (&self->pipebase);
    }
    else {
        nn_sws_recv_hdr (self);
    }

    return;
}